

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void ypr_substmt(lys_ypr_ctx_conflict *pctx,ly_stmt substmt,uint8_t substmt_index,char *text,
                void *exts)

{
  uint16_t *puVar1;
  byte bVar2;
  ulong in_RAX;
  char *elem_name;
  char *attr_name;
  char *pcVar3;
  bool flag;
  undefined7 uStack_38;
  int8_t extflag;
  
  _uStack_38 = in_RAX & 0xffffffffffffff;
  if (text != (char *)0x0) {
    bVar2 = lys_stmt_flags(substmt);
    flag = (bVar2 & 1) != 0;
    if (flag) {
      _uStack_38 = CONCAT17(1,uStack_38);
      elem_name = lys_stmt_str(substmt);
      attr_name = (char *)0x0;
      pcVar3 = (char *)0x0;
    }
    else {
      elem_name = lys_stmt_str(substmt);
      attr_name = lys_stmt_arg(substmt);
      pcVar3 = text;
    }
    ypr_open(pctx,elem_name,attr_name,pcVar3,flag);
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 + 1;
    yprp_extension_instances(pctx,substmt,substmt_index,(lysp_ext_instance *)exts,&extflag);
    bVar2 = lys_stmt_flags(substmt);
    if ((bVar2 & 1) != 0) {
      pcVar3 = lys_stmt_arg(substmt);
      ypr_yin_arg(pctx,pcVar3,text);
    }
    puVar1 = &(pctx->field_0).field_0.level;
    *puVar1 = *puVar1 - 1;
    pcVar3 = lys_stmt_str(substmt);
    ypr_close(pctx,pcVar3,extflag);
  }
  return;
}

Assistant:

static void
ypr_substmt(struct lys_ypr_ctx *pctx, enum ly_stmt substmt, uint8_t substmt_index, const char *text, void *exts)
{
    int8_t extflag = 0;

    if (!text) {
        /* nothing to print */
        return;
    }

    if (lys_stmt_flags(substmt) & LY_STMT_FLAG_YIN) {
        extflag = 1;
        ypr_open(pctx, lys_stmt_str(substmt), NULL, NULL, extflag);
    } else {
        ypr_open(pctx, lys_stmt_str(substmt), lys_stmt_arg(substmt), text, extflag);
    }

    LEVEL++;
    yprp_extension_instances(pctx, substmt, substmt_index, exts, &extflag);

    /* argument as yin-element */
    if (lys_stmt_flags(substmt) & LY_STMT_FLAG_YIN) {
        ypr_yin_arg(pctx, lys_stmt_arg(substmt), text);
    }

    LEVEL--;
    ypr_close(pctx, lys_stmt_str(substmt), extflag);
}